

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

CTcPrsGramNode * __thiscall CTcParser::flatten_gram_rule(CTcParser *this,int *err)

{
  int iVar1;
  CTcPrsGramNode *pCVar2;
  undefined4 extraout_var;
  CTcPrsGramNode *pCVar3;
  
  pCVar3 = (CTcPrsGramNode *)0x0;
  pCVar2 = parse_gram_or(this,err,0);
  if (pCVar2 != (CTcPrsGramNode *)0x0) {
    if (*err == 0) {
      iVar1 = (*(pCVar2->super_CTcTokenSource)._vptr_CTcTokenSource[3])(pCVar2);
      pCVar2 = (CTcPrsGramNode *)CONCAT44(extraout_var,iVar1);
      (*(pCVar2->super_CTcTokenSource)._vptr_CTcTokenSource[4])(pCVar2);
      iVar1 = (*(pCVar2->super_CTcTokenSource)._vptr_CTcTokenSource[5])(pCVar2);
      pCVar3 = pCVar2;
      if (iVar1 == 0) {
        pCVar3 = (CTcPrsGramNode *)CTcPrsMem::alloc(G_prsmem,0x88);
        pCVar3->next_ = (CTcPrsGramNode *)0x0;
        pCVar3[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
        pCVar3[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)0x0;
        *(undefined8 *)&pCVar3[1].super_CTcTokenSource.enclosing_curtok_ = 0;
        (pCVar3->super_CTcTokenSource).enclosing_src_ = (CTcTokenSource *)0x0;
        *(undefined8 *)&(pCVar3->super_CTcTokenSource).enclosing_curtok_ = 0;
        (pCVar3->super_CTcTokenSource).enclosing_curtok_.text_ = (char *)0x0;
        (pCVar3->super_CTcTokenSource).enclosing_curtok_.text_len_ = 0;
        (pCVar3->super_CTcTokenSource).enclosing_curtok_.int_val_ = 0;
        *(undefined8 *)&(pCVar3->super_CTcTokenSource).enclosing_curtok_.field_0x20 = 0;
        pCVar3[1].super_CTcTokenSource.enclosing_curtok_.text_ = (char *)0x0;
        pCVar3[1].super_CTcTokenSource.enclosing_curtok_.text_len_ = 0;
        pCVar3[1].super_CTcTokenSource.enclosing_curtok_.int_val_ = 0;
        *(undefined8 *)&pCVar3[1].super_CTcTokenSource.enclosing_curtok_.field_0x20 = 0;
        pCVar3[1].next_ = (CTcPrsGramNode *)0x0;
        pCVar3[2].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)0x0;
        (pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource =
             (_func_int **)&PTR__CTcTokenSource_00313fd0;
        pCVar3[1].super_CTcTokenSource._vptr_CTcTokenSource = (_func_int **)pCVar2;
        pCVar3[1].super_CTcTokenSource.enclosing_src_ = (CTcTokenSource *)pCVar2;
        pCVar2->next_ = (CTcPrsGramNode *)0x0;
      }
      (*(pCVar3->super_CTcTokenSource)._vptr_CTcTokenSource[8])(pCVar3);
    }
    else {
      pCVar3 = (CTcPrsGramNode *)0x0;
    }
  }
  return pCVar3;
}

Assistant:

CTcPrsGramNode *CTcParser::flatten_gram_rule(int *err)
{
    /* first, build the top-level 'or' tree */
    CTcPrsGramNode *tree = parse_gram_or(err, 0);
    if (tree == 0 || *err != 0)
        return 0;

    /* move all of the OR's to a single OR at the top of the tree */
    tree = tree->consolidate_or();

    /* flatten CAT nodes in the resulting tree */
    tree->flatten_cat();

    /* 
     *   if the top-level node isn't an OR, insert an OR at the top - this
     *   makes the tree always follow the same shape, which makes it easier
     *   to step through the tokens in the expansion
     */
    if (!tree->is_or())
    {
        CTcPrsGramNodeOr *new_or;

        /* create an OR node for the root of the tree */
        new_or = new (G_prsmem) CTcPrsGramNodeOr();

        /* insert our old root as the single alternative under the OR */
        new_or->add_sub_item(tree);

        /* the OR is now the root of the tree */
        tree = new_or;
    }

    /* start reading from the first token in the tree */
    tree->init_expansion();

    /* return the tree */
    return tree;
}